

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

QByteArray * __thiscall Preamble::get(QByteArray *__return_storage_ptr__,Preamble *this,QString *fn)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  char cVar4;
  storage_type *psVar5;
  storage_type *psVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QArrayDataPointer<char> local_80;
  QArrayDataPointer<char> local_68;
  char *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_str).d.size == 0) {
    local_48 = 0xaaaaaaaaaaaaaaaa;
    uStack_40 = 0xaaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_48,fn);
    cVar4 = QFile::open((QFile *)&local_48,0x11);
    if (cVar4 == '\0') {
      local_68.d._0_4_ = 2;
      local_68.size._4_4_ = 0;
      local_68.d._4_4_ = 0;
      local_68.ptr._0_4_ = 0;
      local_68.ptr._4_4_ = 0;
      local_68.size._0_4_ = 0;
      local_50 = "default";
      QString::toLocal8Bit((QByteArray *)&local_80,fn);
      if (local_80.ptr == (char *)0x0) {
        local_80.ptr = (char *)&QByteArray::_empty;
      }
      QMessageLogger::warning((char *)&local_68,"Failed to open %s",local_80.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
    }
    else {
      QIODevice::readAll();
      pDVar2 = (this->m_str).d.d;
      pcVar3 = (this->m_str).d.ptr;
      (this->m_str).d.d = (Data *)CONCAT44(local_68.d._4_4_,local_68.d._0_4_);
      (this->m_str).d.ptr = (char *)CONCAT44(local_68.ptr._4_4_,local_68.ptr._0_4_);
      local_68.d._0_4_ = SUB84(pDVar2,0);
      local_68.d._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
      local_68.ptr._0_4_ = SUB84(pcVar3,0);
      local_68.ptr._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
      qVar1 = (this->m_str).d.size;
      (this->m_str).d.size = CONCAT44(local_68.size._4_4_,(undefined4)local_68.size);
      local_68.size._0_4_ = (undefined4)qVar1;
      local_68.size._4_4_ = (undefined4)((ulong)qVar1 >> 0x20);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
      psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("FOO",4);
      psVar6 = (storage_type *)QByteArrayView::lengthHelperCharArray("QtGui",6);
      QVar7.m_data = psVar5;
      QVar7.m_size = (qsizetype)this;
      QVar8.m_data = psVar6;
      QVar8.m_size = (qsizetype)"FOO";
      QByteArray::replace(QVar7,QVar8);
      QByteArray::append(&this->m_str,
                         "\n// This file is automatically generated by qvkgen. Do not edit.\n");
    }
    QArrayDataPointer<char>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char> *)this);
    QFile::~QFile((QFile *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_00104784;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_00104784:
      __stack_chk_fail();
    }
    QArrayDataPointer<char>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char> *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray Preamble::get(const QString &fn)
{
    if (!m_str.isEmpty())
        return m_str;

    QFile f(fn);
    if (!f.open(QIODevice::ReadOnly | QIODevice::Text)) {
        qWarning("Failed to open %s", qPrintable(fn));
        return m_str;
    }

    m_str = f.readAll();
    m_str.replace("FOO", "QtGui");
    m_str += "\n// This file is automatically generated by qvkgen. Do not edit.\n";

    return m_str;
}